

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageAnalyzer.cpp
# Opt level: O2

void __thiscall pageAnalyzer::decomposePageContent(pageAnalyzer *this)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  int iVar4;
  char cVar5;
  size_type sVar6;
  allocator local_51;
  string tmp;
  
  std::__cxx11::string::string((string *)&tmp,"",&local_51);
  pcVar2 = (this->inputPage)._M_dataplus._M_p;
  sVar3 = (this->inputPage)._M_string_length;
  sVar6 = 0;
  iVar4 = 0x17;
  do {
    if (sVar3 == sVar6) {
      std::__cxx11::string::~string((string *)&tmp);
      return;
    }
    cVar1 = pcVar2[sVar6];
    cVar5 = (char)&tmp;
    if (iVar4 == 0x17) {
      if (cVar1 == '<') {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->pageContent,&tmp);
        iVar4 = 0x18;
LAB_00102db3:
        tmp._M_string_length = 0;
        *tmp._M_dataplus._M_p = '\0';
      }
      else {
        std::__cxx11::string::push_back(cVar5);
        iVar4 = 0x17;
      }
    }
    else {
      if (cVar1 == '>') {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->pageContent,&tmp);
        iVar4 = 0x17;
        goto LAB_00102db3;
      }
      std::__cxx11::string::push_back(cVar5);
      iVar4 = 0x18;
    }
    sVar6 = sVar6 + 1;
  } while( true );
}

Assistant:

void pageAnalyzer::decomposePageContent()
{
    std::string tmp = std::string("");
    int state = OUTSIDE_ANGLEBRACKET;
    for (char i : this->inputPage)
    {
        if(state == OUTSIDE_ANGLEBRACKET)
        {
            if(i != '<')
                tmp += i;
            else
            {
                state = INSIDE_ANGLEBRACKET;
                this->pageContent.push_back(tmp);
                tmp.clear();
            }
        }
        else if(state == INSIDE_ANGLEBRACKET)
        {
            if(i != '>')
                tmp += i;
            else
            {
                state = OUTSIDE_ANGLEBRACKET;
                this->pageContent.push_back(tmp);
                tmp.clear();
            }
        }
        else;
    }
}